

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void despot::logging::stream(int level,ostream *out)

{
  log_ostream *this;
  string sStack_38;
  
  if (level - 1U < 5) {
    this = (log_ostream *)operator_new(0x1a0);
    std::__cxx11::string::string
              ((string *)&sStack_38,(string *)(markers__abi_cxx11_ + (ulong)(uint)level * 0x20));
    log_ostream::log_ostream(this,out,&sStack_38);
    *(log_ostream **)(streams_ + (ulong)(uint)level * 8) = this;
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void logging::stream(int level, ostream& out) {
	if (level >= ERROR && level <= VERBOSE) {
		streams_[level] = new log_ostream(out, markers_[level]);
	}
}